

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_cross_product.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalCrossProduct::LogicalCrossProduct
          (LogicalCrossProduct *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *left,unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *right)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_18;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_10;
  
  local_10._M_head_impl =
       (left->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (left->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  local_18._M_head_impl =
       (right->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (right->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalUnconditionalJoin::LogicalUnconditionalJoin
            (&this->super_LogicalUnconditionalJoin,LOGICAL_CROSS_PRODUCT,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_10,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_18);
  if (local_18._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_18._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_18._M_head_impl = (LogicalOperator *)0x0;
  if (local_10._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_10._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  (this->super_LogicalUnconditionalJoin).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalOperator_024ac180;
  return;
}

Assistant:

LogicalCrossProduct::LogicalCrossProduct(unique_ptr<LogicalOperator> left, unique_ptr<LogicalOperator> right)
    : LogicalUnconditionalJoin(LogicalOperatorType::LOGICAL_CROSS_PRODUCT, std::move(left), std::move(right)) {
}